

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcTendon::~IfcTendon(IfcTendon *this)

{
  IfcElement *this_00;
  void *pvVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   ((long)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
           super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> + 0x10) = 0x93f328;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x90 = 0x93f490;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x130 = 0x93f350;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x140 = 0x93f378;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x178 = 0x93f3a0;
  *(undefined8 *)&this[-1].field_0x1a8 = 0x93f3c8;
  this[-1].PreStress.ptr = 4.79057907783173e-317;
  this[-1].FrictionCoefficient.ptr = 4.79059884045756e-317;
  this[-1].AnchorageSlip.ptr = 4.7906186030834e-317;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x93f468;
  pvVar1 = *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                      super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                      field_0x10;
  if ((undefined1 *)pvVar1 !=
      &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
       super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x20) {
    operator_delete(pvVar1);
  }
  this_00 = (IfcElement *)
            ((long)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> + 0x10);
  *(undefined8 *)
   ((long)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
           super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> + 0x10) = 0x93f6f8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x90 = 0x93f838;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x130 = 0x93f720;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x140 = 0x93f748;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x178 = 0x93f770;
  *(undefined8 *)&this[-1].field_0x1a8 = 0x93f798;
  this[-1].PreStress.ptr = 4.79106128590207e-317;
  this[-1].FrictionCoefficient.ptr = 4.7910810485279e-317;
  this[-1].AnchorageSlip.ptr = 4.79110081115374e-317;
  puVar2 = (undefined1 *)this[-1].MinCurvatureRadius.ptr;
  if (puVar2 != &this[-1].field_0x220) {
    operator_delete(puVar2);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__0093f4c0);
  operator_delete(this_00);
  return;
}

Assistant:

IfcTendon() : Object("IfcTendon") {}